

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O2

void flatbuffers::AppendOption
               (stringstream *ss,FlatCOption *option,size_t max_col,size_t min_col_for_description)

{
  ostream *poVar1;
  size_type sVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  string description;
  
  poVar1 = (ostream *)(ss + 0x10);
  std::operator<<(poVar1,"  ");
  sVar2 = (option->short_opt)._M_string_length;
  if (sVar2 == 0) {
    uVar4 = 2;
  }
  else {
    poVar3 = std::operator<<(poVar1,"-");
    std::operator<<(poVar3,(string *)option);
    if ((option->long_opt)._M_string_length == 0) {
      uVar4 = sVar2 + 4;
    }
    else {
      uVar4 = sVar2 + 5;
      std::operator<<(poVar1,",");
    }
    std::operator<<(poVar1," ");
  }
  sVar2 = (option->long_opt)._M_string_length;
  if (sVar2 != 0) {
    uVar4 = uVar4 + sVar2 + 3;
    poVar3 = std::operator<<(poVar1,"--");
    poVar3 = std::operator<<(poVar3,(string *)&option->long_opt);
    std::operator<<(poVar3," ");
  }
  sVar2 = (option->parameter)._M_string_length;
  if (sVar2 != 0) {
    uVar4 = uVar4 + sVar2 + 1;
    poVar3 = std::operator<<(poVar1,(string *)&option->parameter);
    std::operator<<(poVar3," ");
  }
  if (uVar4 < 0x1a) {
    for (lVar5 = uVar4 - 0x19; lVar5 != 0; lVar5 = lVar5 + 1) {
      std::operator<<(poVar1," ");
    }
  }
  else {
    std::operator<<(poVar1,"\n");
    description._M_dataplus._M_p = (pointer)&description.field_2;
    std::__cxx11::string::_M_construct((ulong)&description,'\x19');
    std::operator<<(poVar1,(string *)&description);
    std::__cxx11::string::~string((string *)&description);
  }
  if ((option->description)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&description,(string *)&option->description);
    AppendTextWrappedString(ss,&description,0x19,min_col_for_description);
    std::__cxx11::string::~string((string *)&description);
  }
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

static void AppendOption(std::stringstream &ss, const FlatCOption &option,
                         size_t max_col, size_t min_col_for_description) {
  size_t chars = 2;
  ss << "  ";
  if (!option.short_opt.empty()) {
    chars += 2 + option.short_opt.length();
    ss << "-" << option.short_opt;
    if (!option.long_opt.empty()) {
      chars++;
      ss << ",";
    }
    ss << " ";
  }
  if (!option.long_opt.empty()) {
    chars += 3 + option.long_opt.length();
    ss << "--" << option.long_opt << " ";
  }
  if (!option.parameter.empty()) {
    chars += 1 + option.parameter.length();
    ss << option.parameter << " ";
  }
  size_t start_of_description = chars;
  if (start_of_description > min_col_for_description) {
    ss << "\n";
    start_of_description = min_col_for_description;
    ss << std::string(start_of_description, ' ');
  } else {
    while (start_of_description < min_col_for_description) {
      ss << " ";
      start_of_description++;
    }
  }
  if (!option.description.empty()) {
    std::string description = option.description;
    AppendTextWrappedString(ss, description, max_col, start_of_description);
  }
  ss << "\n";
}